

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_iTXt(LodePNGInfo *info,LodePNGDecompressSettings *zlibsettings,uchar *data,
                   size_t chunkLength)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *key_00;
  char *langtag_00;
  char *transkey_00;
  ulong in_RCX;
  long in_RDX;
  ucvector decoded;
  char *transkey;
  char *langtag;
  char *key;
  uint compressed;
  uint begin;
  uint length;
  uint i;
  uint error;
  LodePNGDecompressSettings *in_stack_ffffffffffffff88;
  uint uVar4;
  undefined1 in_stack_ffffffffffffff94;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  uchar *in_stack_ffffffffffffff98;
  uchar **in_stack_ffffffffffffffa0;
  uchar **in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc8;
  uint local_2c;
  uint local_28;
  uint local_24;
  
  ucvector_init((ucvector *)&stack0xffffffffffffff98);
  if (in_RCX < 5) {
    local_24 = 0x1e;
  }
  else {
    local_2c = 0;
    while( true ) {
      uVar7 = false;
      if (local_2c < in_RCX) {
        uVar7 = *(char *)(in_RDX + (ulong)local_2c) != '\0';
      }
      if ((bool)uVar7 == false) break;
      local_2c = local_2c + 1;
    }
    if (local_2c + 3 < in_RCX) {
      if ((local_2c == 0) || (0x4f < local_2c)) {
        local_24 = 0x59;
      }
      else {
        key_00 = (char *)lodepng_malloc(0x12e7c0);
        if (key_00 == (char *)0x0) {
          local_24 = 0x53;
        }
        else {
          key_00[local_2c] = '\0';
          for (local_28 = 0; local_28 != local_2c; local_28 = local_28 + 1) {
            key_00[local_28] = *(char *)(in_RDX + (ulong)local_28);
          }
          uVar1 = (uint)*(byte *)(in_RDX + (ulong)(local_2c + 1));
          if (*(char *)(in_RDX + (ulong)(local_2c + 2)) == '\0') {
            uVar2 = local_2c + 3;
            local_2c = 0;
            local_28 = uVar2;
            while( true ) {
              uVar6 = false;
              if (local_28 < in_RCX) {
                uVar6 = *(char *)(in_RDX + (ulong)local_28) != '\0';
              }
              if ((bool)uVar6 == false) break;
              local_2c = local_2c + 1;
              local_28 = local_28 + 1;
            }
            langtag_00 = (char *)lodepng_malloc(0x12e8cf);
            if (langtag_00 == (char *)0x0) {
              local_24 = 0x53;
            }
            else {
              langtag_00[local_2c] = '\0';
              for (local_28 = 0; local_28 != local_2c; local_28 = local_28 + 1) {
                langtag_00[local_28] = *(char *)(in_RDX + (ulong)(uVar2 + local_28));
              }
              uVar2 = local_2c + 1 + uVar2;
              local_2c = 0;
              local_28 = uVar2;
              while( true ) {
                uVar5 = false;
                if (local_28 < in_RCX) {
                  uVar5 = *(char *)(in_RDX + (ulong)local_28) != '\0';
                }
                if ((bool)uVar5 == false) break;
                local_2c = local_2c + 1;
                local_28 = local_28 + 1;
              }
              transkey_00 = (char *)lodepng_malloc(0x12e9ae);
              if (transkey_00 == (char *)0x0) {
                local_24 = 0x53;
              }
              else {
                transkey_00[local_2c] = '\0';
                for (local_28 = 0; local_28 != local_2c; local_28 = local_28 + 1) {
                  transkey_00[local_28] = *(char *)(in_RDX + (ulong)(uVar2 + local_28));
                }
                uVar2 = local_2c + 1 + uVar2;
                if ((uint)in_RCX < uVar2) {
                  uVar4 = 0;
                }
                else {
                  uVar4 = (uint)in_RCX - uVar2;
                }
                if (uVar1 == 0) {
                  uVar3 = ucvector_resize((ucvector *)in_stack_ffffffffffffff88,0x12eac3);
                  if (uVar3 == 0) {
                    local_24 = 0x53;
                    goto LAB_0012eb40;
                  }
                  in_stack_ffffffffffffff98[uVar4] = '\0';
                  for (local_28 = 0; local_28 != uVar4; local_28 = local_28 + 1) {
                    in_stack_ffffffffffffff98[local_28] =
                         *(uchar *)(in_RDX + (ulong)(uVar2 + local_28));
                  }
                }
                else {
                  local_24 = zlib_decompress(in_stack_ffffffffffffffa8,
                                             (size_t *)in_stack_ffffffffffffffa0,
                                             in_stack_ffffffffffffff98,
                                             CONCAT17(uVar7,CONCAT16(uVar6,CONCAT15(uVar5,CONCAT14(
                                                  in_stack_ffffffffffffff94,uVar4)))),
                                             in_stack_ffffffffffffff88);
                  if (local_24 != 0) goto LAB_0012eb40;
                  if (in_stack_ffffffffffffffa8 < in_stack_ffffffffffffffa0) {
                    in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa0;
                  }
                  ucvector_push_back((ucvector *)in_stack_ffffffffffffff88,'\0');
                }
                local_24 = lodepng_add_itext((LodePNGInfo *)
                                             CONCAT44(uVar1,in_stack_ffffffffffffffc8),key_00,
                                             langtag_00,transkey_00,
                                             (char *)in_stack_ffffffffffffffa8);
              }
            }
          }
          else {
            local_24 = 0x48;
          }
        }
      }
    }
    else {
      local_24 = 0x4b;
    }
  }
LAB_0012eb40:
  lodepng_free((void *)0x12eb4a);
  lodepng_free((void *)0x12eb54);
  lodepng_free((void *)0x12eb5e);
  ucvector_cleanup((void *)0x12eb68);
  return local_24;
}

Assistant:

static unsigned readChunk_iTXt(LodePNGInfo* info, const LodePNGDecompressSettings* zlibsettings,
                               const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  unsigned i;

  unsigned length, begin, compressed;
  char *key = 0, *langtag = 0, *transkey = 0;
  ucvector decoded;
  ucvector_init(&decoded); /* TODO: only use in case of compressed text */

  while(!error) /*not really a while loop, only used to break on error*/ {
    /*Quick check if the chunk length isn't too small. Even without check
    it'd still fail with other error checks below if it's too short. This just gives a different error code.*/
    if(chunkLength < 5) CERROR_BREAK(error, 30); /*iTXt chunk too short*/

    /*read the key*/
    for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
    if(length + 3 >= chunkLength) CERROR_BREAK(error, 75); /*no null termination char, corrupt?*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    key[length] = 0;
    for(i = 0; i != length; ++i) key[i] = (char)data[i];

    /*read the compression method*/
    compressed = data[length + 1];
    if(data[length + 2] != 0) CERROR_BREAK(error, 72); /*the 0 byte indicating compression must be 0*/

    /*even though it's not allowed by the standard, no error is thrown if
    there's no null termination char, if the text is empty for the next 3 texts*/

    /*read the langtag*/
    begin = length + 3;
    length = 0;
    for(i = begin; i < chunkLength && data[i] != 0; ++i) ++length;

    langtag = (char*)lodepng_malloc(length + 1);
    if(!langtag) CERROR_BREAK(error, 83); /*alloc fail*/

    langtag[length] = 0;
    for(i = 0; i != length; ++i) langtag[i] = (char)data[begin + i];

    /*read the transkey*/
    begin += length + 1;
    length = 0;
    for(i = begin; i < chunkLength && data[i] != 0; ++i) ++length;

    transkey = (char*)lodepng_malloc(length + 1);
    if(!transkey) CERROR_BREAK(error, 83); /*alloc fail*/

    transkey[length] = 0;
    for(i = 0; i != length; ++i) transkey[i] = (char)data[begin + i];

    /*read the actual text*/
    begin += length + 1;

    length = (unsigned)chunkLength < begin ? 0 : (unsigned)chunkLength - begin;

    if(compressed) {
      /*will fail if zlib error, e.g. if length is too small*/
      error = zlib_decompress(&decoded.data, &decoded.size,
                              &data[begin],
                              length, zlibsettings);
      if(error) break;
      if(decoded.allocsize < decoded.size) decoded.allocsize = decoded.size;
      ucvector_push_back(&decoded, 0);
    } else {
      if(!ucvector_resize(&decoded, length + 1)) CERROR_BREAK(error, 83 /*alloc fail*/);

      decoded.data[length] = 0;
      for(i = 0; i != length; ++i) decoded.data[i] = data[begin + i];
    }

    error = lodepng_add_itext(info, key, langtag, transkey, (char*)decoded.data);

    break;
  }

  lodepng_free(key);
  lodepng_free(langtag);
  lodepng_free(transkey);
  ucvector_cleanup(&decoded);

  return error;
}